

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

char * zt_cstr_dup(char *s,ssize_t i,ssize_t j,ssize_t n)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  if (s == (char *)0x0) {
    return (char *)0x0;
  }
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar7 = 0;
    lVar6 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar6 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar6) {
      lVar6 = sVar1 - 1;
    }
    lVar7 = lVar6;
    if (lVar6 < lVar4) {
      lVar7 = lVar4;
    }
    if (lVar4 < lVar6) {
      lVar6 = lVar4;
    }
  }
  lVar2 = lVar6 - lVar7;
  lVar4 = -lVar2;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  pcVar3 = (char *)zt_malloc_p((lVar4 + 1) * n + 1);
  pcVar5 = pcVar3;
  while (0 < n) {
    n = n + -1;
    for (lVar4 = lVar6; lVar4 <= lVar7; lVar4 = lVar4 + 1) {
      *pcVar5 = s[lVar4];
      pcVar5 = pcVar5 + 1;
    }
  }
  *pcVar5 = '\0';
  return pcVar3;
}

Assistant:

char *
zt_cstr_dup(const char *s, ssize_t i, ssize_t j, ssize_t n) {
    ssize_t   k;
    char    * new;
    char    * p;

    zt_assert(n >= 0);

    if (!s) {
        return NULL;
    }

    CONVERT(s, i, j);

    p = new = zt_malloc(char, (n * IDXLEN(i, j)) + 1);

    if (IDXLEN(i, j) > 0) {
        while (n-- > 0) {
            for (k = i; k <= j; k++) {
                *p++ = s[k];
            }
        }
    }

    *p = '\0';

    return new;
}